

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutTests.cpp
# Opt level: O2

void __thiscall
solitaire::LayoutTests_getFoundationPilePosition_Test::TestBody
          (LayoutTests_getFoundationPilePosition_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_90;
  Position local_88 [4];
  AssertionResult gtest_ar;
  undefined8 local_58;
  undefined8 uStack_50;
  Position pilePosition4;
  Position pilePosition3;
  Position pilePosition2;
  PileId local_2c;
  PileId local_28;
  PileId local_24;
  PileId local_20;
  PileId local_1c;
  Position pilePosition1;
  
  pilePosition1.x = 0x11b;
  pilePosition1.y = 0x1e;
  pilePosition2.x = 0x174;
  pilePosition2.y = 0x1e;
  pilePosition3.x = 0x1cd;
  pilePosition3.y = 0x1e;
  pilePosition4.x = 0x226;
  pilePosition4.y = 0x1e;
  local_1c.t = 0;
  local_88[0] = Layout::getFoundationPilePosition(&local_1c);
  testing::internal::CmpHelperEQ<solitaire::geometry::Position,solitaire::geometry::Position>
            ((internal *)&gtest_ar,"Layout::getFoundationPilePosition(PileId {0})","pilePosition1",
             local_88,&pilePosition1);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_88);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/LayoutTests.cpp"
               ,0x11,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_88[0] != (Position)0x0) {
      (**(code **)(*(long *)local_88[0] + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_20.t = 1;
  local_88[0] = Layout::getFoundationPilePosition(&local_20);
  testing::internal::CmpHelperEQ<solitaire::geometry::Position,solitaire::geometry::Position>
            ((internal *)&gtest_ar,"Layout::getFoundationPilePosition(PileId {1})","pilePosition2",
             local_88,&pilePosition2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_88);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/LayoutTests.cpp"
               ,0x12,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_88[0] != (Position)0x0) {
      (**(code **)(*(long *)local_88[0] + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_24.t = 2;
  local_88[0] = Layout::getFoundationPilePosition(&local_24);
  testing::internal::CmpHelperEQ<solitaire::geometry::Position,solitaire::geometry::Position>
            ((internal *)&gtest_ar,"Layout::getFoundationPilePosition(PileId {2})","pilePosition3",
             local_88,&pilePosition3);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_88);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/LayoutTests.cpp"
               ,0x13,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_88[0] != (Position)0x0) {
      (**(code **)(*(long *)local_88[0] + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_28.t = 3;
  local_88[0] = Layout::getFoundationPilePosition(&local_28);
  testing::internal::CmpHelperEQ<solitaire::geometry::Position,solitaire::geometry::Position>
            ((internal *)&gtest_ar,"Layout::getFoundationPilePosition(PileId {3})","pilePosition4",
             local_88,&pilePosition4);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_88);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/LayoutTests.cpp"
               ,0x14,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_88[0] != (Position)0x0) {
      (**(code **)(*(long *)local_88[0] + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  gtest_ar._0_8_ = &local_58;
  local_58 = 0;
  uStack_50 = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    local_2c.t = 4;
    Layout::getFoundationPilePosition(&local_2c);
  }
  std::__cxx11::string::assign(&gtest_ar.success_);
  testing::Message::Message((Message *)local_88);
  testing::internal::AssertHelper::AssertHelper
            (&local_90,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/LayoutTests.cpp"
             ,0x15,(char *)gtest_ar._0_8_);
  testing::internal::AssertHelper::operator=(&local_90,(Message *)local_88);
  testing::internal::AssertHelper::~AssertHelper(&local_90);
  if (local_88[0] != (Position)0x0) {
    (**(code **)(*(long *)local_88[0] + 8))();
  }
  std::__cxx11::string::~string((string *)&gtest_ar);
  return;
}

Assistant:

TEST(LayoutTests, getFoundationPilePosition) {
    Position pilePosition1 {283, 30};
    Position pilePosition2 {372, 30};
    Position pilePosition3 {461, 30};
    Position pilePosition4 {550, 30};

    EXPECT_EQ(Layout::getFoundationPilePosition(PileId {0}), pilePosition1);
    EXPECT_EQ(Layout::getFoundationPilePosition(PileId {1}), pilePosition2);
    EXPECT_EQ(Layout::getFoundationPilePosition(PileId {2}), pilePosition3);
    EXPECT_EQ(Layout::getFoundationPilePosition(PileId {3}), pilePosition4);
    EXPECT_THROW(Layout::getFoundationPilePosition(PileId {4}), std::runtime_error);
}